

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::StringTrieBuilder::writeBranchSubNode
          (StringTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex,int32_t length)

{
  int iVar1;
  uint uVar2;
  int32_t iVar3;
  int32_t iVar4;
  bool local_e9;
  uint local_d0;
  int local_cc;
  int32_t value;
  int32_t offset;
  int32_t jumpTargets [4];
  int iStack_b0;
  UChar unit;
  int32_t i_1;
  int32_t unitNumber;
  UBool isFinal [4];
  int32_t starts [5];
  int local_8c;
  int32_t i;
  int32_t ltLength;
  int32_t lessThan [14];
  UChar middleUnits [14];
  int local_20;
  int32_t length_local;
  int32_t unitIndex_local;
  int32_t limit_local;
  int32_t start_local;
  StringTrieBuilder *this_local;
  
  local_8c = 0;
  unitIndex_local = start;
  for (local_20 = length; iVar1 = (*(this->super_UObject)._vptr_UObject[0xb])(), iVar1 < local_20;
      local_20 = local_20 - local_20 / 2) {
    uVar2 = (*(this->super_UObject)._vptr_UObject[8])
                      (this,(ulong)(uint)unitIndex_local,(ulong)(uint)unitIndex,
                       (long)local_20 / 2 & 0xffffffff);
    iVar1 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar2,(ulong)(uint)unitIndex);
    middleUnits[(long)local_8c + -4] = (UChar)iVar1;
    iVar3 = writeBranchSubNode(this,unitIndex_local,uVar2,unitIndex,local_20 / 2);
    (&i)[local_8c] = iVar3;
    local_8c = local_8c + 1;
    unitIndex_local = uVar2;
  }
  iStack_b0 = 0;
  do {
    *(int32_t *)(isFinal + (long)iStack_b0 * 4 + -4) = unitIndex_local;
    jumpTargets[3] = unitIndex_local + 1;
    iVar1 = (*(this->super_UObject)._vptr_UObject[4])
                      (this,(ulong)(uint)unitIndex_local,(ulong)(uint)unitIndex);
    jumpTargets[2]._2_2_ = (ushort)iVar1;
    jumpTargets[3] =
         (*(this->super_UObject)._vptr_UObject[9])
                   (this,(ulong)(uint)jumpTargets[3],(ulong)(uint)unitIndex,
                    (ulong)jumpTargets[2]._2_2_);
    local_e9 = false;
    if (unitIndex_local == jumpTargets[3] + -1) {
      iVar1 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(uint)unitIndex_local);
      local_e9 = unitIndex + 1 == iVar1;
    }
    iVar3 = jumpTargets[3];
    *(bool *)((long)&i_1 + (long)iStack_b0) = local_e9;
    unitIndex_local = jumpTargets[3];
    iStack_b0 = iStack_b0 + 1;
  } while (iStack_b0 < local_20 + -1);
  *(int32_t *)(isFinal + (long)iStack_b0 * 4 + -4) = jumpTargets[3];
  do {
    iVar1 = iStack_b0 + -1;
    if (*(char *)((long)&i_1 + (long)iVar1) == '\0') {
      iVar4 = writeNode(this,*(int32_t *)(isFinal + (long)iVar1 * 4 + -4),
                        *(int32_t *)(isFinal + (long)iStack_b0 * 4 + -4),unitIndex + 1);
      (&value)[iVar1] = iVar4;
    }
    iStack_b0 = iVar1;
  } while (0 < iVar1);
  iStack_b0 = local_20 + -1;
  writeNode(this,iVar3,limit,unitIndex + 1);
  uVar2 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)(uint)iVar3,(ulong)(uint)unitIndex);
  local_cc = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)(uVar2 & 0xffff));
  while (iStack_b0 = iStack_b0 + -1, -1 < iStack_b0) {
    uVar2 = *(uint *)(isFinal + (long)iStack_b0 * 4 + -4);
    if (*(char *)((long)&i_1 + (long)iStack_b0) == '\0') {
      local_d0 = local_cc - (&value)[iStack_b0];
    }
    else {
      local_d0 = (*(this->super_UObject)._vptr_UObject[5])(this,(ulong)uVar2);
    }
    (*(this->super_UObject)._vptr_UObject[0x11])
              (this,(ulong)local_d0,(ulong)(uint)(int)*(char *)((long)&i_1 + (long)iStack_b0));
    uVar2 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar2,(ulong)(uint)unitIndex);
    local_cc = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)(uVar2 & 0xffff));
  }
  while (0 < local_8c) {
    local_8c = local_8c + -1;
    (*(this->super_UObject)._vptr_UObject[0x13])(this,(ulong)(uint)(&i)[local_8c]);
    local_cc = (*(this->super_UObject)._vptr_UObject[0xf])
                         (this,(ulong)(ushort)middleUnits[(long)local_8c + -4]);
  }
  return local_cc;
}

Assistant:

int32_t
StringTrieBuilder::writeBranchSubNode(int32_t start, int32_t limit, int32_t unitIndex, int32_t length) {
    UChar middleUnits[kMaxSplitBranchLevels];
    int32_t lessThan[kMaxSplitBranchLevels];
    int32_t ltLength=0;
    while(length>getMaxBranchLinearSubNodeLength()) {
        // Branch on the middle unit.
        // First, find the middle unit.
        int32_t i=skipElementsBySomeUnits(start, unitIndex, length/2);
        // Encode the less-than branch first.
        middleUnits[ltLength]=getElementUnit(i, unitIndex);  // middle unit
        lessThan[ltLength]=writeBranchSubNode(start, i, unitIndex, length/2);
        ++ltLength;
        // Continue for the greater-or-equal branch.
        start=i;
        length=length-length/2;
    }
    // For each unit, find its elements array start and whether it has a final value.
    int32_t starts[kMaxBranchLinearSubNodeLength];
    UBool isFinal[kMaxBranchLinearSubNodeLength-1];
    int32_t unitNumber=0;
    do {
        int32_t i=starts[unitNumber]=start;
        UChar unit=getElementUnit(i++, unitIndex);
        i=indexOfElementWithNextUnit(i, unitIndex, unit);
        isFinal[unitNumber]= start==i-1 && unitIndex+1==getElementStringLength(start);
        start=i;
    } while(++unitNumber<length-1);
    // unitNumber==length-1, and the maxUnit elements range is [start..limit[
    starts[unitNumber]=start;

    // Write the sub-nodes in reverse order: The jump lengths are deltas from
    // after their own positions, so if we wrote the minUnit sub-node first,
    // then its jump delta would be larger.
    // Instead we write the minUnit sub-node last, for a shorter delta.
    int32_t jumpTargets[kMaxBranchLinearSubNodeLength-1];
    do {
        --unitNumber;
        if(!isFinal[unitNumber]) {
            jumpTargets[unitNumber]=writeNode(starts[unitNumber], starts[unitNumber+1], unitIndex+1);
        }
    } while(unitNumber>0);
    // The maxUnit sub-node is written as the very last one because we do
    // not jump for it at all.
    unitNumber=length-1;
    writeNode(start, limit, unitIndex+1);
    int32_t offset=write(getElementUnit(start, unitIndex));
    // Write the rest of this node's unit-value pairs.
    while(--unitNumber>=0) {
        start=starts[unitNumber];
        int32_t value;
        if(isFinal[unitNumber]) {
            // Write the final value for the one string ending with this unit.
            value=getElementValue(start);
        } else {
            // Write the delta to the start position of the sub-node.
            value=offset-jumpTargets[unitNumber];
        }
        writeValueAndFinal(value, isFinal[unitNumber]);
        offset=write(getElementUnit(start, unitIndex));
    }
    // Write the split-branch nodes.
    while(ltLength>0) {
        --ltLength;
        writeDeltaTo(lessThan[ltLength]);
        offset=write(middleUnits[ltLength]);
    }
    return offset;
}